

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O3

void amrex::BLBackTrace::print_backtrace_info(string *filename)

{
  ostringstream *this;
  FILE *__stream;
  Print local_198;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"w");
  if (__stream != (FILE *)0x0) {
    print_backtrace_info((FILE *)__stream);
    fclose(__stream);
    return;
  }
  local_198.os = OutStream();
  local_198.rank = *(int *)(DAT_0071a620 + -0x30);
  this = &local_198.ss;
  local_198.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) =
       *(undefined8 *)(local_198.os + *(long *)(*(long *)local_198.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"Warning @ BLBackTrace::print_backtrace_info: ",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this," is not a valid output file.",0x1c);
  std::ios::widen((char)*(undefined8 *)(local_198._16_8_ + -0x18) + (char)this);
  std::ostream::put((char)this);
  std::ostream::flush();
  Print::~Print(&local_198);
  return;
}

Assistant:

void
BLBackTrace::print_backtrace_info (const std::string& filename)
{
    if (FILE* p = fopen(filename.c_str(), "w"))
    {
      BLBackTrace::print_backtrace_info(p);
      fclose(p);
    }
    else
    {
        amrex::Print() << "Warning @ BLBackTrace::print_backtrace_info: "
                       << filename << " is not a valid output file."
                       << std::endl;
    }
}